

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O0

vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> * __thiscall
LargeGapGrayCode::getBinaryCode
          (vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> *__return_storage_ptr__,
          LargeGapGrayCode *this,int bitWidth)

{
  reference pvVar1;
  __type _Var2;
  int local_54;
  int i;
  bitset<20UL> bs;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> ts;
  int bitWidth_local;
  LargeGapGrayCode *this_local;
  vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> *binaryCode;
  
  ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
  ._3_1_ = 0;
  ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
  ._4_4_ = bitWidth;
  std::vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>::vector
            (__return_storage_ptr__);
  getTransitionSequence
            ((vector<int,_std::allocator<int>_> *)local_38,this,
             ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_);
  std::bitset<20UL>::bitset((bitset<20UL> *)&stack0xffffffffffffffb0,0);
  local_54 = 0;
  while( true ) {
    _Var2 = std::pow<int,int>(2,ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
    if (_Var2 <= (double)local_54) break;
    std::vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>::push_back
              (__return_storage_ptr__,(value_type *)&stack0xffffffffffffffb0);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_38,(long)local_54);
    std::bitset<20UL>::flip((bitset<20UL> *)&stack0xffffffffffffffb0,(long)*pvVar1);
    local_54 = local_54 + 1;
  }
  ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
  ._3_1_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  if ((ts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._3_1_ & 1) == 0) {
    std::vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::bitset<20> > LargeGapGrayCode::getBinaryCode(int bitWidth)
{
	std::vector<std::bitset<20> > binaryCode;

	std::vector<int> ts = getTransitionSequence(bitWidth);
	std::bitset<20> bs(0);

	for(int i = 0; i < pow(2, bitWidth); i++)
	{
		binaryCode.push_back(bs);
		bs.flip(ts[i]);
	}

	return binaryCode;
}